

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::start_announcing(torrent *this)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  peer_list *ppVar3;
  _Map_pointer ppptVar4;
  session_interface *psVar5;
  bool in;
  int iVar6;
  undefined4 extraout_var;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 in_RDX;
  char *pcVar7;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    bVar2 = this->field_0x5c0;
    if (((bVar2 & 8) != 0) ||
       ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1)) {
      if ((bVar2 & 0x40) == 0) {
        this->field_0x5c0 = bVar2 | 0x40;
        ppVar3 = (this->super_torrent_hot_members).m_peer_list._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if ((ppVar3 == (peer_list *)0x0) ||
           (ppptVar4 = (ppVar3->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node,
           (int)((int)((ulong)((long)(ppVar3->m_peers).
                                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                     .
                                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(ppVar3->m_peers).
                                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    .
                                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
                 (int)((ulong)((long)(ppVar3->m_peers).
                                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                     .
                                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)(ppVar3->m_peers).
                                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    .
                                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                ((((uint)((int)ppptVar4 -
                         *(int *)&(ppVar3->m_peers).
                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                  .
                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (uint)(ppptVar4 == (_Map_pointer)0x0)) * 0x40) < 0x32)) {
          iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x49])();
          if (CONCAT44(extraout_var,iVar6) != 0) {
            psVar5 = (this->super_torrent_hot_members).m_ses;
            ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::aux::torrent,void>
                      ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)
                       &local_28,
                       (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                       &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
            local_38 = local_28;
            local_30 = local_20;
            if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_20->_M_weak_count = local_20->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                local_20->_M_weak_count = local_20->_M_weak_count + 1;
              }
            }
            (*(psVar5->super_session_logger)._vptr_session_logger[0x4a])(psVar5,&local_38);
            if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &local_30->_M_weak_count;
                iVar6 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar6 = local_30->_M_weak_count;
                local_30->_M_weak_count = iVar6 + -1;
              }
              if (iVar6 == 1) {
                (*local_30->_vptr__Sp_counted_base[3])();
              }
            }
            if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
            }
          }
        }
        tracker_list::reset(&this->m_trackers);
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x50 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x38 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x10 = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x18 = 0;
        *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL> = 0;
        *(undefined8 *)
         &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x8 = 0;
        this->m_total_failed_bytes = 0;
        this->m_total_redundant_bytes = 0;
        in = want_tick(this);
        update_list(this,(torrent_list_index_t)0x1,in);
        announce_with_tracker(this,none);
        lsd_announce(this);
      }
      return;
    }
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar7 = "start_announcing(), files not checked (with valid metadata)";
  }
  else {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar7 = "start_announcing(), paused";
  }
  (*UNRECOVERED_JUMPTABLE)(this,pcVar7,in_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void torrent::start_announcing()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(state() != torrent_status::checking_files);
		if (is_paused())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), paused");
#endif
			return;
		}
		// if we don't have metadata, we need to announce
		// before checking files, to get peers to
		// request the metadata from
		if (!m_files_checked && valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), files not checked (with valid metadata)");
#endif
			return;
		}
		if (m_announcing) return;

		m_announcing = true;

#ifndef TORRENT_DISABLE_DHT
		if ((!m_peer_list || m_peer_list->num_peers() < 50) && m_ses.dht())
		{
			// we don't have any peers, prioritize
			// announcing this torrent with the DHT
			m_ses.prioritize_dht(shared_from_this());
		}
#endif

		// tell the tracker that we're back
		m_trackers.reset();

		// reset the stats, since from the tracker's
		// point of view, this is a new session
		m_total_failed_bytes = 0;
		m_total_redundant_bytes = 0;
		m_stat.clear();

		update_want_tick();

		announce_with_tracker();

		lsd_announce();
	}